

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O1

int CVodeSetNonlinearSolver(void *cvode_mem,SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver_Ops p_Var1;
  SUNNonlinearSolver_Type SVar2;
  int iVar3;
  int error_code;
  code *SysFn;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar3 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    goto LAB_00436888;
  }
  if (NLS == (SUNNonlinearSolver)0x0) {
    msgfmt = "NLS must be non-NULL";
    cvode_mem = (CVodeMem)0x0;
  }
  else {
    p_Var1 = NLS->ops;
    if (((p_Var1->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
        (p_Var1->solve ==
         (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_realtype_int_void_ptr *)0x0)) ||
       (p_Var1->setsysfn == (_func_int_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
      msgfmt = "NLS does not support required operations";
    }
    else {
      if ((*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8) != (SUNNonlinearSolver)0x0) &&
         (*(int *)((long)cvode_mem + 0x3d0) != 0)) {
        SUNNonlinSolFree(*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8));
      }
      *(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8) = NLS;
      *(undefined4 *)((long)cvode_mem + 0x3d0) = 0;
      SVar2 = SUNNonlinSolGetType(NLS);
      if (SVar2 == SUNNONLINEARSOLVER_ROOTFIND) {
        SysFn = cvNlsResidual;
      }
      else {
        SVar2 = SUNNonlinSolGetType(NLS);
        if (SVar2 != SUNNONLINEARSOLVER_FIXEDPOINT) {
          msgfmt = "Invalid nonlinear solver type";
          goto LAB_00436883;
        }
        SysFn = cvNlsFPFunction;
      }
      iVar3 = SUNNonlinSolSetSysFn(*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8),SysFn);
      if (iVar3 == 0) {
        iVar3 = SUNNonlinSolSetConvTestFn
                          (*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8),cvNlsConvTest,cvode_mem)
        ;
        if (iVar3 == 0) {
          iVar3 = SUNNonlinSolSetMaxIters(*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8),3);
          if (iVar3 == 0) {
            *(undefined4 *)((long)cvode_mem + 0x2b8) = 0;
            if (*(long *)((long)cvode_mem + 0x10) != 0) {
              *(long *)((long)cvode_mem + 0x3d8) = *(long *)((long)cvode_mem + 0x10);
              return 0;
            }
            msgfmt = "The ODE RHS function is NULL";
          }
          else {
            msgfmt = "Setting maximum number of nonlinear iterations failed";
          }
        }
        else {
          msgfmt = "Setting convergence test function failed";
        }
      }
      else {
        msgfmt = "Setting nonlinear system function failed";
      }
    }
  }
LAB_00436883:
  iVar3 = -0x16;
  error_code = -0x16;
LAB_00436888:
  cvProcessError((CVodeMem)cvode_mem,error_code,"CVODE","CVodeSetNonlinearSolver",msgfmt);
  return iVar3;
}

Assistant:

int CVodeSetNonlinearSolver(void *cvode_mem, SUNNonlinearSolver NLS)
{
  CVodeMem cv_mem;
  int retval;

  /* Return immediately if CVode memory is NULL */
  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetNonlinearSolver", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  /* Return immediately if NLS memory is NULL */
  if (NLS == NULL) {
    cvProcessError(NULL, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "NLS must be non-NULL");
    return (CV_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if ( NLS->ops->gettype    == NULL ||
       NLS->ops->solve      == NULL ||
       NLS->ops->setsysfn   == NULL ) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "NLS does not support required operations");
    return(CV_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((cv_mem->NLS != NULL) && (cv_mem->ownNLS))
    retval = SUNNonlinSolFree(cv_mem->NLS);

  /* set SUNNonlinearSolver pointer */
  cv_mem->NLS = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, CVODE will set the flag to SUNTRUE after this function returns. */
  cv_mem->ownNLS = SUNFALSE;

  /* set the nonlinear system function */
  if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_ROOTFIND) {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLS, cvNlsResidual);
  } else if (SUNNonlinSolGetType(NLS) ==  SUNNONLINEARSOLVER_FIXEDPOINT) {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLS, cvNlsFPFunction);
  } else {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "Invalid nonlinear solver type");
    return(CV_ILL_INPUT);
  }

  if (retval != CV_SUCCESS) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "Setting nonlinear system function failed");
    return(CV_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(cv_mem->NLS, cvNlsConvTest, cvode_mem);
  if (retval != CV_SUCCESS) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "Setting convergence test function failed");
    return(CV_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(cv_mem->NLS, NLS_MAXCOR);
  if (retval != CV_SUCCESS) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "Setting maximum number of nonlinear iterations failed");
    return(CV_ILL_INPUT);
  }

  /* Reset the acnrmcur flag to SUNFALSE */
  cv_mem->cv_acnrmcur = SUNFALSE;

  /* Set the nonlinear system RHS function */
  if (!(cv_mem->cv_f)) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "The ODE RHS function is NULL");
    return(CV_ILL_INPUT);
  }
  cv_mem->nls_f = cv_mem->cv_f;

  return(CV_SUCCESS);
}